

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O1

prf_state_t * prf_state_clone(prf_state_t *original)

{
  matrix4x4_f32_t *paafVar1;
  matrix4x4_f32_t *paafVar2;
  prf_node_t *ppVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint uVar14;
  int iVar15;
  prf_state_t *state;
  prf_node_t **pppVar16;
  void *elem;
  matrix4x4_f32_t **ppaafVar17;
  ulong uVar18;
  bool bVar19;
  
  state = prf_state_create();
  if (state == (prf_state_t *)0x0) {
LAB_001070d8:
    state = (prf_state_t *)0x0;
  }
  else {
    ppVar3 = original->node;
    state->model = original->model;
    state->node = ppVar3;
    ppVar3 = original->vertex_palette;
    state->header = original->header;
    state->vertex_palette = ppVar3;
    state->object_transparency = original->object_transparency;
    state->object_flags = original->object_flags;
    ppVar3 = original->material_palette;
    state->color_palette = original->color_palette;
    state->material_palette = ppVar3;
    uVar14 = prf_array_count(original->materials);
    if (0 < (int)uVar14) {
      pppVar16 = state->materials;
      uVar18 = 0;
      do {
        pppVar16 = (prf_node_t **)prf_array_append_ptr(pppVar16,original->materials[uVar18]);
        uVar18 = uVar18 + 1;
      } while (uVar14 != uVar18);
      state->materials = pppVar16;
    }
    uVar14 = prf_array_count(original->textures);
    if (0 < (int)uVar14) {
      pppVar16 = state->textures;
      uVar18 = 0;
      do {
        pppVar16 = (prf_node_t **)prf_array_append_ptr(pppVar16,original->textures[uVar18]);
        uVar18 = uVar18 + 1;
      } while (uVar14 != uVar18);
      state->textures = pppVar16;
    }
    uVar14 = prf_array_count(original->instances);
    if (0 < (int)uVar14) {
      pppVar16 = state->instances;
      uVar18 = 0;
      do {
        pppVar16 = (prf_node_t **)prf_array_append_ptr(pppVar16,original->instances[uVar18]);
        uVar18 = uVar18 + 1;
      } while (uVar14 != uVar18);
      state->instances = pppVar16;
    }
    uVar18 = 0;
    do {
      ppaafVar17 = state->matrix;
      iVar15 = prf_array_count(ppaafVar17);
      if ((long)iVar15 <= (long)uVar18) {
        elem = malloc(0x40);
        if (elem == (void *)0x0) {
          prf_state_destroy(state);
          goto LAB_001070d8;
        }
        ppaafVar17 = (matrix4x4_f32_t **)prf_array_append_ptr(ppaafVar17,elem);
        state->matrix = ppaafVar17;
      }
      paafVar1 = state->matrix[uVar18];
      paafVar2 = original->matrix[uVar18];
      uVar4 = *(undefined8 *)(*paafVar2)[0];
      uVar5 = *(undefined8 *)((*paafVar2)[0] + 2);
      uVar6 = *(undefined8 *)(*paafVar2)[1];
      uVar7 = *(undefined8 *)((*paafVar2)[1] + 2);
      uVar8 = *(undefined8 *)(*paafVar2)[2];
      uVar9 = *(undefined8 *)((*paafVar2)[2] + 2);
      uVar10 = *(undefined8 *)((*paafVar2)[3] + 2);
      *(undefined8 *)(*paafVar1)[3] = *(undefined8 *)(*paafVar2)[3];
      *(undefined8 *)((*paafVar1)[3] + 2) = uVar10;
      *(undefined8 *)(*paafVar1)[2] = uVar8;
      *(undefined8 *)((*paafVar1)[2] + 2) = uVar9;
      *(undefined8 *)(*paafVar1)[1] = uVar6;
      *(undefined8 *)((*paafVar1)[1] + 2) = uVar7;
      *(undefined8 *)(*paafVar1)[0] = uVar4;
      *(undefined8 *)((*paafVar1)[0] + 2) = uVar5;
      bVar19 = uVar18 < original->state_push_level;
      uVar18 = uVar18 + 1;
    } while (bVar19);
    iVar15 = original->inv_dirty;
    state->inv_dirty = iVar15;
    if (iVar15 == 0) {
      paafVar1 = state->inv_matrix;
      paafVar2 = original->inv_matrix;
      uVar4 = *(undefined8 *)(*paafVar2)[0];
      uVar5 = *(undefined8 *)((*paafVar2)[0] + 2);
      uVar6 = *(undefined8 *)(*paafVar2)[1];
      uVar7 = *(undefined8 *)((*paafVar2)[1] + 2);
      uVar8 = *(undefined8 *)(*paafVar2)[2];
      uVar9 = *(undefined8 *)((*paafVar2)[2] + 2);
      uVar10 = *(undefined8 *)((*paafVar2)[3] + 2);
      *(undefined8 *)(*paafVar1)[3] = *(undefined8 *)(*paafVar2)[3];
      *(undefined8 *)((*paafVar1)[3] + 2) = uVar10;
      *(undefined8 *)(*paafVar1)[2] = uVar8;
      *(undefined8 *)((*paafVar1)[2] + 2) = uVar9;
      *(undefined8 *)(*paafVar1)[1] = uVar6;
      *(undefined8 *)((*paafVar1)[1] + 2) = uVar7;
      *(undefined8 *)(*paafVar1)[0] = uVar4;
      *(undefined8 *)((*paafVar1)[0] + 2) = uVar5;
    }
    uVar11 = original->subface_level;
    uVar12 = original->attribute_level;
    uVar13 = original->extension_level;
    state->push_level = original->push_level;
    state->subface_level = uVar11;
    state->attribute_level = uVar12;
    state->extension_level = uVar13;
    uVar11 = original->physical_level;
    state->state_push_level = original->state_push_level;
    state->physical_level = uVar11;
  }
  return state;
}

Assistant:

prf_state_t *
prf_state_clone(
    prf_state_t * original )
{
    prf_state_t * clone;
    int cnt, i;

    assert( original != NULL );

    clone = prf_state_create();
    if ( clone == NULL )
        return NULL;
    clone->model = original->model;
    clone->node = original->node;
    clone->header = original->header;
    clone->vertex_palette = original->vertex_palette;
    clone->object_transparency = original->object_transparency;
    clone->object_flags = original->object_flags;
    clone->color_palette = original->color_palette;
    clone->material_palette = original->material_palette;
    cnt = prf_array_count( original->materials );
    for ( i = 0; i < cnt; i++ )
      clone->materials = (prf_node_t **)
	prf_array_append_ptr( clone->materials, original->materials[i] );
    cnt = prf_array_count( original->textures );
    for ( i = 0; i < cnt; i++ )
      clone->textures = (prf_node_t **) 
	prf_array_append_ptr( clone->textures, original->textures[i] );

    cnt = prf_array_count( original->instances );
    for ( i = 0; i < cnt; i++ )
      clone->instances = (prf_node_t **)
	prf_array_append_ptr( clone->instances, original->instances[i] );

    for ( i = 0; i <= original->state_push_level; i++ ) {
        if ( i >= prf_array_count( clone->matrix ) ) {
            matrix4x4_f32_t * m;
            m = (matrix4x4_f32_t *)malloc( sizeof( matrix4x4_f32_t ) );
            if ( m == NULL ) {
                prf_state_destroy( clone );
                return NULL;
            }
            clone->matrix = 
	      (matrix4x4_f32_t **)prf_array_append_ptr( clone->matrix, m );
        }
        memcpy( clone->matrix[i], original->matrix[i],
            sizeof( matrix4x4_f32_t ) );
    }

    clone->inv_dirty = original->inv_dirty;
    if ( clone->inv_dirty == FALSE )
        memcpy( clone->inv_matrix, original->inv_matrix,
            sizeof( matrix4x4_f32_t ) );

    clone->push_level = original->push_level;
    clone->subface_level = original->subface_level;
    clone->extension_level = original->extension_level;
    clone->attribute_level = original->attribute_level;

    clone->state_push_level = original->state_push_level;
    clone->physical_level = original->physical_level;

    return clone;
}